

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O1

SRes crnlib::LzmaDec_DecodeToDic
               (CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  uint uVar2;
  uint uVar3;
  UInt16 *pUVar4;
  Byte *pBVar5;
  ELzmaDummy EVar6;
  int iVar7;
  ELzmaStatus EVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Byte *pBVar14;
  CLzmaDec *pCVar15;
  SizeT inSize;
  bool bVar16;
  uint local_6c;
  Byte *local_48;
  
  inSize = *srcLen;
  *srcLen = 0;
  pCVar15 = p;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  buf = p->tempBuf;
  do {
    if (p->remainLen == 0x112) {
      if (p->code == 0) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
      }
      return (uint)(p->code != 0);
    }
    local_6c = (uint)pCVar15;
    if (p->needFlush == 0) {
LAB_00192e62:
      uVar11 = p->dicPos;
      if (uVar11 < dicLimit) {
LAB_00192e9d:
        if (p->needInitState != 0) {
          uVar2 = (p->prop).lp;
          uVar3 = (p->prop).lc;
          pUVar4 = p->probs;
          uVar12 = 0;
          do {
            pUVar4[uVar12] = 0x400;
            uVar12 = uVar12 + 1;
          } while ((0x300 << ((char)uVar2 + (char)uVar3 & 0x1fU)) + 0x736 != uVar12);
          p->reps[3] = 1;
          p->reps[1] = 1;
          p->reps[2] = 1;
          p->state = 0;
          p->reps[0] = 1;
          p->needInitState = 0;
        }
        uVar2 = p->tempBufSize;
        uVar12 = (ulong)uVar2;
        if (uVar12 == 0) {
          if (inSize < 0x14 || dicLimit <= uVar11) {
            EVar6 = LzmaDec_TryDummy(p,src,inSize);
            if (EVar6 == DUMMY_ERROR) {
              memcpy(buf,src,inSize);
              p->tempBufSize = (uint)inSize;
              *srcLen = *srcLen + inSize;
              pCVar15 = (CLzmaDec *)0x0;
              EVar8 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_001930fc:
              *status = EVar8;
              bVar16 = false;
              pBVar14 = local_48;
            }
            else {
              bVar16 = true;
              pBVar14 = src;
              if (uVar11 < dicLimit) {
                pCVar15 = (CLzmaDec *)((ulong)pCVar15 & 0xffffffff);
              }
              else {
                pCVar15 = (CLzmaDec *)((ulong)pCVar15 & 0xffffffff);
                if (EVar6 != DUMMY_MATCH) {
                  pCVar15 = (CLzmaDec *)0x1;
                  EVar8 = LZMA_STATUS_NOT_FINISHED;
                  goto LAB_001930fc;
                }
              }
            }
            if (bVar16) goto LAB_0019310c;
            bVar16 = false;
          }
          else {
            pCVar15 = (CLzmaDec *)((ulong)pCVar15 & 0xffffffff);
            pBVar14 = src + (inSize - 0x14);
LAB_0019310c:
            p->buf = src;
            iVar9 = LzmaDec_DecodeReal2(p,dicLimit,pBVar14);
            if (iVar9 == 0) {
              pBVar5 = p->buf;
              lVar10 = (long)pBVar5 - (long)src;
              *srcLen = *srcLen + lVar10;
              inSize = inSize - lVar10;
              bVar16 = true;
              src = pBVar5;
            }
            else {
              pCVar15 = (CLzmaDec *)0x1;
              bVar16 = false;
            }
          }
          local_48 = pBVar14;
          if (!bVar16) {
            bVar16 = false;
            goto LAB_00193176;
          }
        }
        else {
          iVar9 = 0;
          bVar16 = uVar2 < 0x14;
          if (bVar16) {
            uVar13 = 0;
            if (inSize != 0) {
              uVar13 = 0;
              do {
                pBVar14 = src + uVar13;
                uVar13 = uVar13 + 1;
                p->tempBuf[uVar12] = *pBVar14;
                bVar16 = uVar12 < 0x13;
                if (!bVar16) break;
                uVar12 = uVar12 + 1;
              } while (uVar13 < inSize);
              iVar9 = (int)uVar13;
              uVar12 = (ulong)(uVar2 + iVar9);
            }
          }
          else {
            uVar13 = 0;
          }
          p->tempBufSize = (uint)uVar12;
          if ((bool)(uVar11 < dicLimit & (bVar16 ^ 1U))) {
LAB_00193056:
            p->buf = buf;
            iVar7 = LzmaDec_DecodeReal2(p,dicLimit,buf);
            bVar16 = iVar7 == 0;
            if (bVar16) {
              uVar11 = (ulong)((iVar9 - (uint)uVar12) + (*(int *)&p->buf - (int)buf));
              *srcLen = *srcLen + uVar11;
              src = src + uVar11;
              inSize = inSize - uVar11;
              p->tempBufSize = 0;
              pCVar15 = (CLzmaDec *)(ulong)local_6c;
            }
            else {
              pCVar15 = (CLzmaDec *)0x1;
            }
          }
          else {
            EVar6 = LzmaDec_TryDummy(p,buf,uVar12);
            if (EVar6 == DUMMY_ERROR) {
              *srcLen = *srcLen + uVar13;
              pCVar15 = (CLzmaDec *)0x0;
              EVar8 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_0019304a:
              *status = EVar8;
              bVar16 = false;
            }
            else {
              bVar16 = true;
              if (uVar11 < dicLimit) {
                pCVar15 = (CLzmaDec *)((ulong)pCVar15 & 0xffffffff);
              }
              else {
                pCVar15 = (CLzmaDec *)((ulong)pCVar15 & 0xffffffff);
                if (EVar6 != DUMMY_MATCH) {
                  pCVar15 = (CLzmaDec *)0x1;
                  EVar8 = LZMA_STATUS_NOT_FINISHED;
                  goto LAB_0019304a;
                }
              }
            }
            if (bVar16) {
              local_6c = (uint)pCVar15;
              goto LAB_00193056;
            }
            bVar16 = false;
          }
          if (!bVar16) goto LAB_001930bd;
        }
        bVar16 = true;
      }
      else {
        if ((p->remainLen == 0) && (p->code == 0)) {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        }
        else {
          if (finishMode != LZMA_FINISH_ANY) {
            if (p->remainLen != 0) {
              *status = LZMA_STATUS_NOT_FINISHED;
              goto LAB_00192e93;
            }
            goto LAB_00192e9d;
          }
          *status = LZMA_STATUS_NOT_FINISHED;
        }
LAB_001930ca:
        bVar16 = false;
        pCVar15 = (CLzmaDec *)0x0;
      }
    }
    else {
      if (inSize != 0) {
        do {
          uVar2 = p->tempBufSize;
          if (4 < (ulong)uVar2) goto LAB_00192e2d;
          BVar1 = *src;
          src = src + 1;
          p->tempBufSize = uVar2 + 1;
          p->tempBuf[uVar2] = BVar1;
          *srcLen = *srcLen + 1;
          inSize = inSize - 1;
        } while (inSize != 0);
        inSize = 0;
      }
LAB_00192e2d:
      if (p->tempBufSize < 5) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        goto LAB_001930ca;
      }
      if (p->tempBuf[0] == '\0') {
        uVar2 = *(uint *)(p->tempBuf + 1);
        p->code = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        p->range = 0xffffffff;
        p->needFlush = 0;
        p->tempBufSize = 0;
        goto LAB_00192e62;
      }
LAB_00192e93:
      pCVar15 = (CLzmaDec *)0x1;
LAB_001930bd:
      bVar16 = false;
    }
LAB_00193176:
    if (!bVar16) {
      return (SRes)pCVar15;
    }
  } while( true );
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec* p, SizeT dicLimit, const Byte* src, SizeT* srcLen,
                         ELzmaFinishMode finishMode, ELzmaStatus* status) {
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);

  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart) {
    int checkEndMarkNow;

    if (p->needFlush != 0) {
      for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
        p->tempBuf[p->tempBufSize++] = *src++;
      if (p->tempBufSize < RC_INIT_SIZE) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      if (p->tempBuf[0] != 0)
        return SZ_ERROR_DATA;

      LzmaDec_InitRc(p, p->tempBuf);
      p->tempBufSize = 0;
    }

    checkEndMarkNow = 0;
    if (p->dicPos >= dicLimit) {
      if (p->remainLen == 0 && p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return SZ_OK;
      }
      if (finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_OK;
      }
      if (p->remainLen != 0) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_ERROR_DATA;
      }
      checkEndMarkNow = 1;
    }

    if (p->needInitState)
      LzmaDec_InitStateReal(p);

    if (p->tempBufSize == 0) {
      SizeT processed;
      const Byte* bufLimit;
      if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, src, inSize);
        if (dummyRes == DUMMY_ERROR) {
          memcpy(p->tempBuf, src, inSize);
          p->tempBufSize = (unsigned)inSize;
          (*srcLen) += inSize;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        bufLimit = src;
      } else
        bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
      p->buf = src;
      if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
        return SZ_ERROR_DATA;
      processed = (SizeT)(p->buf - src);
      (*srcLen) += processed;
      src += processed;
      inSize -= processed;
    } else {
      unsigned rem = p->tempBufSize, lookAhead = 0;
      while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
        p->tempBuf[rem++] = src[lookAhead++];
      p->tempBufSize = rem;
      if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
        if (dummyRes == DUMMY_ERROR) {
          (*srcLen) += lookAhead;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
      }
      p->buf = p->tempBuf;
      if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
        return SZ_ERROR_DATA;
      lookAhead -= (rem - (unsigned)(p->buf - p->tempBuf));
      (*srcLen) += lookAhead;
      src += lookAhead;
      inSize -= lookAhead;
      p->tempBufSize = 0;
    }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}